

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varenaalloc.h
# Opt level: O2

char * __thiscall VArenaAlloc::allocObject(VArenaAlloc *this,uint32_t size,uint32_t alignment)

{
  char *pcVar1;
  ulong uVar2;
  
  pcVar1 = this->fCursor;
  uVar2 = (ulong)(-(int)pcVar1 & alignment - 1);
  if ((ulong)((long)this->fEnd - (long)pcVar1) < size + uVar2) {
    ensureSpace(this,size,alignment);
    pcVar1 = this->fCursor;
    uVar2 = (ulong)(alignment - 1 & -(int)pcVar1);
  }
  return pcVar1 + uVar2;
}

Assistant:

char* allocObject(uint32_t size, uint32_t alignment) {
        uintptr_t mask = alignment - 1;
        uintptr_t alignedOffset = (~reinterpret_cast<uintptr_t>(fCursor) + 1) & mask;
        uintptr_t totalSize = size + alignedOffset;
        AssertRelease(totalSize >= size);

        if (totalSize > static_cast<uintptr_t>(fEnd - fCursor)) {
            this->ensureSpace(size, alignment);
            alignedOffset = (~reinterpret_cast<uintptr_t>(fCursor) + 1) & mask;
        }
        return fCursor + alignedOffset;
    }